

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_sine_c++.cpp
# Opt level: O1

int __thiscall Sine::open(Sine *this,char *__file,int __oflag,...)

{
  PaError PVar1;
  PaDeviceInfo *pPVar2;
  PaStreamParameters outputParameters;
  PaStreamParameters local_38;
  
  local_38.device = (PaDeviceIndex)__file;
  if (local_38.device != -1) {
    pPVar2 = Pa_GetDeviceInfo(local_38.device);
    if (pPVar2 != (PaDeviceInfo *)0x0) {
      printf("Output device name: \'%s\'\r");
    }
    local_38.channelCount = 2;
    local_38.sampleFormat = 1;
    pPVar2 = Pa_GetDeviceInfo(local_38.device);
    local_38.suggestedLatency = pPVar2->defaultLowOutputLatency;
    local_38.hostApiSpecificStreamInfo = (void *)0x0;
    PVar1 = Pa_OpenStream(&this->stream,(PaStreamParameters *)0x0,&local_38,44100.0,0,1,paCallback,
                          this);
    if (PVar1 != 0) {
      return 0;
    }
    PVar1 = Pa_SetStreamFinishedCallback(this->stream,paStreamFinished);
    if (PVar1 == 0) {
      return 1;
    }
    Pa_CloseStream(this->stream);
    this->stream = (PaStream *)0x0;
  }
  return 0;
}

Assistant:

bool open(PaDeviceIndex index)
    {
        PaStreamParameters outputParameters;

        outputParameters.device = index;
        if (outputParameters.device == paNoDevice) {
            return false;
        }

        const PaDeviceInfo* pInfo = Pa_GetDeviceInfo(index);
        if (pInfo != 0)
        {
            printf("Output device name: '%s'\r", pInfo->name);
        }

        outputParameters.channelCount = 2;       /* stereo output */
        outputParameters.sampleFormat = paFloat32; /* 32 bit floating point output */
        outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
        outputParameters.hostApiSpecificStreamInfo = NULL;

        PaError err = Pa_OpenStream(
            &stream,
            NULL, /* no input */
            &outputParameters,
            SAMPLE_RATE,
            paFramesPerBufferUnspecified,
            paClipOff,      /* we won't output out of range samples so don't bother clipping them */
            &Sine::paCallback,
            this            /* Using 'this' for userData so we can cast to Sine* in paCallback method */
            );

        if (err != paNoError)
        {
            /* Failed to open stream to device !!! */
            return false;
        }

        err = Pa_SetStreamFinishedCallback( stream, &Sine::paStreamFinished );

        if (err != paNoError)
        {
            Pa_CloseStream( stream );
            stream = 0;

            return false;
        }

        return true;
    }